

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O0

void __thiscall
fill<64U,_49U,_buffer_layout_bfs>::operator()
          (fill<64U,_49U,_buffer_layout_bfs> *this,array<Stream,_64UL> *streams,uchar **buffer,
          array<unsigned_long,_64UL> *buffer_count)

{
  size_t sVar1;
  uchar **ppuVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  long lVar8;
  array<unsigned_long,_64UL> *buffer_count_local;
  uchar **buffer_local;
  array<Stream,_64UL> *streams_local;
  fill<64U,_49U,_buffer_layout_bfs> *this_local;
  long local_38;
  size_t n_1;
  size_t n;
  size_t empty;
  
  pvVar6 = std::array<unsigned_long,_64UL>::operator[](buffer_count,0x31);
  if (*pvVar6 != 0) {
    __assert_fail("buffer_count[I] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x13b,
                  "void fill_leaf(std::array<Stream, K> &__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict, std::true_type) [K = 64U, I = 49U, BufferLayout = buffer_layout_bfs]"
                 );
  }
  pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
  sVar1 = pvVar7->n;
  pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
  if (sVar1 + pvVar7->n < 0x17) {
    pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
    sVar1 = pvVar7->n;
    pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
    lVar8 = (0x17 - sVar1) - pvVar7->n;
    n_1 = 0x17;
    pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
    sVar1 = n_1;
    if (pvVar7->n == 0) {
LAB_0017af3d:
      n_1 = sVar1;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
      ppuVar4 = pvVar7->stream;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
      ppuVar2 = pvVar7->stream;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,ppuVar2 + pvVar7->n,buffer + lVar8 + (0x128a - n_1));
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
      pvVar7->n = 0;
      pvVar6 = std::array<unsigned_long,_64UL>::operator[](buffer_count,0x31);
      *pvVar6 = 0x17 - lVar8;
    }
    else {
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
      if (pvVar7->n != 0) {
        do {
          pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
          puVar3 = *pvVar7->stream;
          pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
          iVar5 = cmp(puVar3,*pvVar7->stream);
          if (iVar5 < 1) {
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
            buffer[lVar8 + (0x128a - n_1)] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
            sVar1 = n_1 - 1;
            if (pvVar7->n == 0) goto LAB_0017af3d;
          }
          else {
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
            buffer[lVar8 + (0x128a - n_1)] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
            sVar1 = n_1 - 1;
            if (pvVar7->n == 0) break;
          }
          n_1 = n_1 - 1;
        } while( true );
      }
      n_1 = sVar1;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
      ppuVar4 = pvVar7->stream;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
      ppuVar2 = pvVar7->stream;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,ppuVar2 + pvVar7->n,buffer + lVar8 + (0x128a - n_1));
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
      pvVar7->n = 0;
      pvVar6 = std::array<unsigned_long,_64UL>::operator[](buffer_count,0x31);
      *pvVar6 = 0x17 - lVar8;
      check_input(buffer + lVar8 + 0x1273,0x17 - lVar8);
    }
  }
  else {
    local_38 = 0x17;
    pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
    lVar8 = local_38;
    if (pvVar7->n == 0) {
LAB_0017b2bd:
      local_38 = lVar8;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
      ppuVar4 = pvVar7->stream;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,pvVar7->stream + local_38,buffer + (0x128a - local_38));
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
      pvVar7->n = pvVar7->n - local_38;
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
      pvVar7->stream = pvVar7->stream + local_38;
      pvVar6 = std::array<unsigned_long,_64UL>::operator[](buffer_count,0x31);
      *pvVar6 = 0x17;
      check_input(buffer + 0x1273,0x17);
    }
    else {
      pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
      if (pvVar7->n == 0) {
LAB_0017b3a0:
        local_38 = lVar8;
        pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
        ppuVar4 = pvVar7->stream;
        pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
        std::copy<unsigned_char**,unsigned_char**>
                  (ppuVar4,pvVar7->stream + local_38,buffer + (0x128a - local_38));
        pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
        pvVar7->n = pvVar7->n - local_38;
        pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
        pvVar7->stream = pvVar7->stream + local_38;
        pvVar6 = std::array<unsigned_long,_64UL>::operator[](buffer_count,0x31);
        *pvVar6 = 0x17;
        check_input(buffer + 0x1273,0x17);
      }
      else {
        for (; local_38 != 0; local_38 = local_38 + -1) {
          pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
          puVar3 = *pvVar7->stream;
          pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
          iVar5 = cmp(puVar3,*pvVar7->stream);
          if (iVar5 < 1) {
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
            buffer[0x128a - local_38] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x22);
            lVar8 = local_38 + -1;
            if (pvVar7->n == 0) goto LAB_0017b2bd;
          }
          else {
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
            buffer[0x128a - local_38] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_64UL>::operator[](streams,0x23);
            lVar8 = local_38 + -1;
            if (pvVar7->n == 0) goto LAB_0017b3a0;
          }
        }
        pvVar6 = std::array<unsigned_long,_64UL>::operator[](buffer_count,0x31);
        *pvVar6 = 0x17;
        check_input(buffer + 0x1273,0x17);
      }
    }
  }
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}